

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_flatten(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int map)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue obj_00;
  JSValue val;
  JSValue val_00;
  JSValue len_val;
  JSValue obj_01;
  JSValue JVar1;
  JSValue source;
  JSValue target;
  int iVar2;
  int64_t iVar3;
  int in_ECX;
  int64_t in_RDX;
  undefined8 in_RDI;
  JSValueUnion *in_R8;
  int in_R9D;
  JSValue JVar4;
  int64_t in_stack_00000070;
  int in_stack_00000078;
  undefined1 in_stack_00000080 [16];
  JSValue in_stack_00000090;
  int depthNum;
  int64_t sourceLen;
  JSValue thisArg;
  JSValue mapperFunction;
  JSValue arr;
  JSValue obj;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  JSValueUnion in_stack_fffffffffffffec8;
  JSValueUnion ctx_00;
  JSValueUnion in_stack_fffffffffffffed0;
  int64_t *in_stack_fffffffffffffed8;
  JSContext *in_stack_fffffffffffffee0;
  JSValueUnion in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  JSValueUnion local_100;
  int64_t local_f8;
  uint uStack_dc;
  JSValueUnion local_d0;
  uint uStack_bc;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar5;
  JSValueUnion in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  JSValueUnion JVar6;
  long lVar7;
  JSValueUnion JVar8;
  undefined4 in_stack_ffffffffffffffd0;
  int32_t iVar9;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar7 = (ulong)uStack_bc << 0x20;
  JVar8.float64 = 1.48219693752374e-323;
  val_00.tag = in_stack_ffffffffffffff60;
  val_00.u.float64 = in_stack_ffffffffffffff58.float64;
  JVar4 = JS_ToObject((JSContext *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      val_00);
  local_d0 = JVar4.u;
  JVar4.tag = in_stack_fffffffffffffef0;
  JVar4.u.ptr = in_stack_fffffffffffffee8.ptr;
  iVar2 = js_get_length64(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,JVar4);
  if (iVar2 == 0) {
    uVar5 = 1;
    ctx_00.ptr = (void *)((ulong)uStack_dc << 0x20);
    JVar6.float64 = 1.48219693752374e-323;
    if (in_R9D == 0) {
      if (((in_ECX < 1) || (iVar2 = JS_IsUndefined(*(JSValue *)in_R8), iVar2 != 0)) ||
         (val.tag = in_stack_fffffffffffffef0, val.u.ptr = in_stack_fffffffffffffee8.ptr,
         iVar2 = JS_ToInt32Sat(in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffed8,val),
         -1 < iVar2)) goto LAB_001b2d95;
    }
    else {
      ctx_00 = (JSValueUnion)in_R8->ptr;
      JVar6 = (JSValueUnion)in_R8[1].ptr;
      obj_00.tag = (int64_t)in_stack_fffffffffffffed8;
      obj_00.u.ptr = in_stack_fffffffffffffed0.ptr;
      iVar2 = check_function((JSContext *)in_stack_fffffffffffffec8.ptr,obj_00);
      if (iVar2 == 0) {
LAB_001b2d95:
        uVar10 = 0;
        uVar11 = 0;
        obj_01.tag = (int64_t)local_d0.ptr;
        obj_01.u.float64 = JVar8.float64;
        len_val.tag = lVar7;
        len_val.u.ptr = JVar6.ptr;
        JVar4 = JS_ArraySpeciesCreate((JSContext *)ctx_00.ptr,obj_01,len_val);
        local_100 = JVar4.u;
        local_f8 = JVar4.tag;
        iVar2 = JS_IsException(JVar4);
        if ((iVar2 == 0) &&
           (target.tag._0_4_ = uVar11, target.u = (JSValueUnion)in_RDI,
           target.tag._4_4_ = in_stack_fffffffffffffff4,
           source.tag._0_4_ = in_stack_ffffffffffffffe0,
           source.u = (JSValueUnion)in_stack_ffffffffffffffd8, source.tag._4_4_ = uVar10,
           iVar3 = JS_FlattenIntoArray((JSContext *)
                                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                                       ,target,source,in_RDX,in_stack_00000070,in_stack_00000078,
                                       (JSValue)in_stack_00000080,in_stack_00000090),
           in_stack_fffffffffffffec0 = uVar5, in_stack_fffffffffffffec8 = ctx_00,
           in_stack_fffffffffffffed0 = JVar6, -1 < iVar3)) {
          v.tag = (int64_t)JVar6.ptr;
          v.u.ptr = ctx_00.ptr;
          JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffec4,uVar5),v);
          iVar9 = local_100.int32;
          in_stack_ffffffffffffffd4 = local_100._4_4_;
          goto LAB_001b2f5c;
        }
      }
    }
  }
  v_00.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
  v_00.u.ptr = in_stack_fffffffffffffec8.ptr;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),v_00);
  v_01.tag = (int64_t)in_stack_fffffffffffffed0.ptr;
  v_01.u.ptr = in_stack_fffffffffffffec8.ptr;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),v_01);
  iVar9 = 0;
  local_f8 = 6;
LAB_001b2f5c:
  JVar1.u._4_4_ = in_stack_ffffffffffffffd4;
  JVar1.u.int32 = iVar9;
  JVar1.tag = local_f8;
  return JVar1;
}

Assistant:

static JSValue js_array_flatten(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv, int map)
{
    JSValue obj, arr;
    JSValueConst mapperFunction, thisArg;
    int64_t sourceLen;
    int depthNum;

    arr = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &sourceLen, obj))
        goto exception;

    depthNum = 1;
    mapperFunction = JS_UNDEFINED;
    thisArg = JS_UNDEFINED;
    if (map) {
        mapperFunction = argv[0];
        if (argc > 1) {
            thisArg = argv[1];
        }
        if (check_function(ctx, mapperFunction))
            goto exception;
    } else {
        if (argc > 0 && !JS_IsUndefined(argv[0])) {
            if (JS_ToInt32Sat(ctx, &depthNum, argv[0]) < 0)
                goto exception;
        }
    }
    arr = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
    if (JS_IsException(arr))
        goto exception;
    if (JS_FlattenIntoArray(ctx, arr, obj, sourceLen, 0, depthNum,
                            mapperFunction, thisArg) < 0)
        goto exception;
    JS_FreeValue(ctx, obj);
    return arr;

exception:
    JS_FreeValue(ctx, obj);
    JS_FreeValue(ctx, arr);
    return JS_EXCEPTION;
}